

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O1

_Bool bson_iter_init_find_case(bson_iter_t *iter,bson_t *bson,char *key)

{
  _Bool _Var1;
  uint8_t *puVar2;
  char *unaff_RBX;
  uint unaff_EBP;
  bson_iter_t *unaff_R14;
  
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_init_find_case_cold_3();
LAB_0011092c:
    bson_iter_init_find_case_cold_2();
LAB_00110931:
    bson_iter_init_find_case_cold_1();
  }
  else {
    if (bson == (bson_t *)0x0) goto LAB_0011092c;
    unaff_RBX = key;
    if (key == (char *)0x0) goto LAB_00110931;
    unaff_EBP = bson->len;
    unaff_R14 = iter;
    if (4 < unaff_EBP) {
      puVar2 = bson_get_data(bson);
      iter->raw = puVar2;
      iter->len = bson->len;
      iter->d1 = 0;
      iter->d2 = 0;
      iter->d3 = 0;
      iter->d4 = 0;
      iter->off = 0;
      iter->type = 0;
      iter->key = 0;
      iter->d1 = 0;
      iter->next_off = 4;
      iter->err_off = 0;
      goto LAB_00110900;
    }
  }
  (unaff_R14->value).value.v_regex.options = (char *)0x0;
  *(undefined8 *)((long)&(unaff_R14->value).value + 0x10) = 0;
  (unaff_R14->value).value_type = BSON_TYPE_EOD;
  (unaff_R14->value).padding = 0;
  (unaff_R14->value).value.v_int64 = 0;
  unaff_R14->d3 = 0;
  unaff_R14->d4 = 0;
  unaff_R14->next_off = 0;
  unaff_R14->err_off = 0;
  unaff_R14->type = 0;
  unaff_R14->key = 0;
  unaff_R14->d1 = 0;
  unaff_R14->d2 = 0;
  unaff_R14->raw = (uint8_t *)0x0;
  unaff_R14->len = 0;
  unaff_R14->off = 0;
LAB_00110900:
  if (4 < unaff_EBP) {
    _Var1 = bson_iter_find_case(unaff_R14,unaff_RBX);
    return _Var1;
  }
  return false;
}

Assistant:

bool
bson_iter_init_find_case (bson_iter_t *iter,  /* INOUT */
                          const bson_t *bson, /* IN */
                          const char *key)    /* IN */
{
   BSON_ASSERT (iter);
   BSON_ASSERT (bson);
   BSON_ASSERT (key);

   return bson_iter_init (iter, bson) && bson_iter_find_case (iter, key);
}